

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

bool togglePhasing(Server *server)

{
  Config *this;
  bool bVar1;
  string_view in_key;
  
  this = (Config *)Jupiter::Config::operator[](server + 0x70,0xd,"RenX.Commands");
  in_key._M_str = "phasing";
  in_key._M_len = 7;
  bVar1 = Jupiter::Config::get<bool>(this,in_key,false);
  bVar1 = togglePhasing(server,!bVar1);
  return bVar1;
}

Assistant:

bool togglePhasing(RenX::Server *server) {
	return togglePhasing(server, !server->varData[RxCommandsSection].get<bool>("phasing"sv, false));
}